

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ECPrivateKey.cpp
# Opt level: O0

ByteString * __thiscall ECPrivateKey::serialise(ECPrivateKey *this)

{
  ByteString *in_RDI;
  ByteString *in_stack_ffffffffffffffa0;
  ByteString *in_stack_ffffffffffffffa8;
  ByteString *in_stack_ffffffffffffffc8;
  
  ByteString::serialise(in_stack_ffffffffffffffc8);
  ByteString::serialise(in_stack_ffffffffffffffc8);
  operator+(in_stack_ffffffffffffffa8,in_stack_ffffffffffffffa0);
  ByteString::~ByteString((ByteString *)0x1a752c);
  ByteString::~ByteString((ByteString *)0x1a7536);
  return in_RDI;
}

Assistant:

ByteString ECPrivateKey::serialise() const
{
	return ec.serialise() +
	       d.serialise();
}